

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O0

bool __thiscall
ManifestParser::Parse(ManifestParser *this,string *filename,string *input,string *err)

{
  pointer *key;
  StringPiece filename_00;
  bool bVar1;
  Token t;
  char *__rhs;
  Lexer *this_00;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  undefined1 local_c0 [8];
  string value;
  undefined1 local_90 [8];
  EvalString let_value;
  string name;
  undefined1 auStack_50 [4];
  Token token;
  StringPiece local_40;
  string *local_30;
  string *err_local;
  string *input_local;
  string *filename_local;
  ManifestParser *this_local;
  
  local_30 = err;
  err_local = input;
  input_local = filename;
  filename_local = (string *)this;
  StringPiece::StringPiece(&local_40,filename);
  StringPiece::StringPiece((StringPiece *)auStack_50,err_local);
  filename_00.len_ = local_40.len_;
  filename_00.str_ = local_40.str_;
  Lexer::Start(&(this->super_Parser).lexer_,filename_00,_auStack_50);
  do {
    t = Lexer::ReadToken(&(this->super_Parser).lexer_);
    switch(t) {
    case ERROR:
      this_00 = &(this->super_Parser).lexer_;
      Lexer::DescribeLastError_abi_cxx11_(&local_e0,this_00);
      this_local._7_1_ = Lexer::Error(this_00,&local_e0,local_30);
      std::__cxx11::string::~string((string *)&local_e0);
      goto LAB_0013c737;
    case BUILD:
      bVar1 = ParseEdge(this,local_30);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0013c737;
      }
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"unexpected ",&local_121);
      __rhs = Lexer::TokenName(t);
      std::operator+(&local_100,&local_120,__rhs);
      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_100,local_30);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
      goto LAB_0013c737;
    case DEFAULT:
      bVar1 = ParseDefault(this,local_30);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0013c737;
      }
      break;
    case IDENT:
      Lexer::UnreadToken(&(this->super_Parser).lexer_);
      key = &let_value.parsed_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)key);
      EvalString::EvalString((EvalString *)local_90);
      bVar1 = ParseLet(this,(string *)key,(EvalString *)local_90,local_30);
      if (bVar1) {
        EvalString::Evaluate_abi_cxx11_
                  ((string *)local_c0,(EvalString *)local_90,&this->env_->super_Env);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&let_value.parsed_.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                "ninja_required_version");
        if (bVar1) {
          CheckNinjaVersion((string *)local_c0);
        }
        BindingEnv::AddBinding
                  (this->env_,
                   (string *)
                   &let_value.parsed_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_c0);
        value.field_2._8_4_ = 4;
        std::__cxx11::string::~string((string *)local_c0);
      }
      else {
        this_local._7_1_ = 0;
        value.field_2._8_4_ = 1;
      }
      EvalString::~EvalString((EvalString *)local_90);
      std::__cxx11::string::~string
                ((string *)
                 &let_value.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (value.field_2._8_4_ == 1) goto LAB_0013c737;
      break;
    case INCLUDE:
      bVar1 = ParseFileInclude(this,false,local_30);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0013c737;
      }
      break;
    case NEWLINE:
      break;
    case POOL:
      bVar1 = ParsePool(this,local_30);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0013c737;
      }
      break;
    case RULE:
      bVar1 = ParseRule(this,local_30);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0013c737;
      }
      break;
    case SUBNINJA:
      bVar1 = ParseFileInclude(this,true,local_30);
      if (!bVar1) {
        this_local._7_1_ = 0;
LAB_0013c737:
        return (bool)(this_local._7_1_ & 1);
      }
      break;
    case TEOF:
      this_local._7_1_ = 1;
      goto LAB_0013c737;
    }
  } while( true );
}

Assistant:

bool ManifestParser::Parse(const string& filename, const string& input,
                           string* err) {
  lexer_.Start(filename, input);

  for (;;) {
    Lexer::Token token = lexer_.ReadToken();
    switch (token) {
    case Lexer::POOL:
      if (!ParsePool(err))
        return false;
      break;
    case Lexer::BUILD:
      if (!ParseEdge(err))
        return false;
      break;
    case Lexer::RULE:
      if (!ParseRule(err))
        return false;
      break;
    case Lexer::DEFAULT:
      if (!ParseDefault(err))
        return false;
      break;
    case Lexer::IDENT: {
      lexer_.UnreadToken();
      string name;
      EvalString let_value;
      if (!ParseLet(&name, &let_value, err))
        return false;
      string value = let_value.Evaluate(env_);
      // Check ninja_required_version immediately so we can exit
      // before encountering any syntactic surprises.
      if (name == "ninja_required_version")
        CheckNinjaVersion(value);
      env_->AddBinding(name, value);
      break;
    }
    case Lexer::INCLUDE:
      if (!ParseFileInclude(false, err))
        return false;
      break;
    case Lexer::SUBNINJA:
      if (!ParseFileInclude(true, err))
        return false;
      break;
    case Lexer::ERROR: {
      return lexer_.Error(lexer_.DescribeLastError(), err);
    }
    case Lexer::TEOF:
      return true;
    case Lexer::NEWLINE:
      break;
    default:
      return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                          err);
    }
  }
  return false;  // not reached
}